

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation
          (AbstractScrollAreaPrivate *this)

{
  ScrollIndicator *pSVar1;
  ScrollIndicator *pSVar2;
  
  QTimer::stop();
  pSVar1 = this->horIndicator;
  pSVar1->needPaint = false;
  pSVar2 = this->vertIndicator;
  pSVar2->needPaint = false;
  pSVar1->animate = false;
  pSVar2->animate = false;
  QWidget::update();
  QWidget::update();
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation()
{
	animationTimer->stop();
	horIndicator->needPaint = false;
	vertIndicator->needPaint = false;
	horIndicator->animate = false;
	vertIndicator->animate = false;
	horIndicator->update();
	vertIndicator->update();
}